

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void CTcSymLocal::s_gen_code_setlcl_stk(int var_num,int is_param)

{
  size_t __n;
  void *__buf;
  uint in_EDI;
  uchar in_stack_000000ef;
  CTcGenTarg *in_stack_000000f0;
  
  if ((int)in_EDI < 0x100) {
    __n = 0xe2;
    CTcGenTarg::write_op(in_stack_000000f0,in_stack_000000ef);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)in_EDI,__buf,__n);
  }
  else {
    CTcGenTarg::write_op(in_stack_000000f0,in_stack_000000ef);
    CTcDataStream::write2((CTcDataStream *)CONCAT44(var_num,is_param),in_EDI);
  }
  CTcGenTarg::note_pop((CTcGenTarg *)0x2d8916);
  return;
}

Assistant:

void CTcSymLocal::s_gen_code_setlcl_stk(int var_num, int is_param)
{
    /* use the shortest form that will fit our variable index */
    if (var_num <= 255)
    {
        /* use the one-byte instruction */
        G_cg->write_op(is_param ? OPC_SETARG1 : OPC_SETLCL1);
        G_cs->write((char)var_num);
    }
    else
    {
        /* big number - use the two-byte instruction */
        G_cg->write_op(is_param ? OPC_SETARG2 : OPC_SETLCL2);
        G_cs->write2(var_num);
    }

    /* the setarg/setlcl ops remove the rvalue */
    G_cg->note_pop();
}